

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mem_manager.cpp
# Opt level: O1

bool __thiscall
SharedMemoryManager::CreateShMem
          (SharedMemoryManager *this,key_t key,size_t size,bool *is_first_created)

{
  ulong *puVar1;
  undefined8 *puVar2;
  char cVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  int *piVar7;
  undefined8 *puVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  allocator local_d1;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  *is_first_created = false;
  this->sh_mem_key_ = key;
  this->sh_mem_size_ = size;
  iVar6 = shmget(key,size,0x7b6);
  this->sh_mem_id_ = iVar6;
  if (-1 < iVar6) {
    *is_first_created = true;
    return true;
  }
  piVar7 = __errno_location();
  iVar6 = *piVar7;
  if ((iVar6 == 0xd) || (iVar6 == 0x11)) {
    bVar5 = GetShMem(this,key,size);
    return bVar5;
  }
  local_70 = local_60;
  cVar3 = (char)(key >> 0x1f);
  if (iVar6 != 0x16) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"shmget error: key [ ","");
    uVar12 = -key;
    if (0 < key) {
      uVar12 = key;
    }
    uVar13 = 1;
    if (9 < uVar12) {
      uVar11 = (ulong)uVar12;
      uVar4 = 4;
      do {
        uVar13 = uVar4;
        uVar10 = (uint)uVar11;
        if (uVar10 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_001047c7;
        }
        if (uVar10 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_001047c7;
        }
        if (uVar10 < 10000) goto LAB_001047c7;
        uVar11 = uVar11 / 10000;
        uVar4 = uVar13 + 4;
      } while (99999 < uVar10);
      uVar13 = uVar13 + 1;
    }
LAB_001047c7:
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar13 - cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)key >> 0x1f) + (long)local_b0),uVar13,uVar12);
    uVar11 = 0xf;
    if (local_70 != local_60) {
      uVar11 = local_60[0];
    }
    if (uVar11 < (ulong)(local_a8 + local_68)) {
      uVar11 = 0xf;
      if (local_b0 != local_a0) {
        uVar11 = local_a0[0];
      }
      if (uVar11 < (ulong)(local_a8 + local_68)) goto LAB_0010483b;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
    }
    else {
LAB_0010483b:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
    }
    local_d0 = &local_c0;
    puVar1 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar1) {
      local_c0 = *puVar1;
      uStack_b8 = puVar8[3];
    }
    else {
      local_c0 = *puVar1;
      local_d0 = (ulong *)*puVar8;
    }
    local_c8 = puVar8[1];
    *puVar8 = puVar1;
    puVar8[1] = 0;
    *(undefined1 *)puVar1 = 0;
    pcVar9 = strerror(*piVar7);
    std::__cxx11::string::string((string *)&local_50,pcVar9,&local_d1);
    uVar11 = 0xf;
    if (local_d0 != &local_c0) {
      uVar11 = local_c0;
    }
    if (uVar11 < (ulong)(local_48 + local_c8)) {
      uVar11 = 0xf;
      if (local_50 != local_40) {
        uVar11 = local_40[0];
      }
      if ((ulong)(local_48 + local_c8) <= uVar11) {
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_d0);
        goto LAB_00104930;
      }
    }
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_50);
    goto LAB_00104930;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"shmget error: key [ ","");
  uVar12 = -key;
  if (0 < key) {
    uVar12 = key;
  }
  uVar13 = 1;
  if (9 < uVar12) {
    uVar11 = (ulong)uVar12;
    uVar4 = 4;
    do {
      uVar13 = uVar4;
      uVar10 = (uint)uVar11;
      if (uVar10 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00104653;
      }
      if (uVar10 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00104653;
      }
      if (uVar10 < 10000) goto LAB_00104653;
      uVar11 = uVar11 / 10000;
      uVar4 = uVar13 + 4;
    } while (99999 < uVar10);
    uVar13 = uVar13 + 1;
  }
LAB_00104653:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar13 - cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)key >> 0x1f) + (long)local_b0),uVar13,uVar12);
  uVar11 = 0xf;
  if (local_70 != local_60) {
    uVar11 = local_60[0];
  }
  if (uVar11 < (ulong)(local_a8 + local_68)) {
    uVar11 = 0xf;
    if (local_b0 != local_a0) {
      uVar11 = local_a0[0];
    }
    if (uVar11 < (ulong)(local_a8 + local_68)) goto LAB_001046c7;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_001046c7:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  local_d0 = &local_c0;
  puVar1 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar8[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (ulong *)*puVar8;
  }
  local_c8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  pcVar9 = strerror(*piVar7);
  std::__cxx11::string::string((string *)&local_50,pcVar9,&local_d1);
  uVar11 = 0xf;
  if (local_d0 != &local_c0) {
    uVar11 = local_c0;
  }
  if (uVar11 < (ulong)(local_48 + local_c8)) {
    uVar11 = 0xf;
    if (local_50 != local_40) {
      uVar11 = local_40[0];
    }
    if ((ulong)(local_48 + local_c8) <= uVar11) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_d0);
      goto LAB_00104930;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_50);
LAB_00104930:
  local_90 = &local_80;
  puVar2 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar2) {
    local_80 = *puVar2;
    uStack_78 = puVar8[3];
  }
  else {
    local_80 = *puVar2;
    local_90 = (undefined8 *)*puVar8;
  }
  local_88 = puVar8[1];
  *puVar8 = puVar2;
  puVar8[1] = 0;
  *(undefined1 *)puVar2 = 0;
  std::__cxx11::string::operator=((string *)&this->err_msg_,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return false;
}

Assistant:

bool SharedMemoryManager::CreateShMem(key_t key, size_t size, bool* is_first_created)
{            
    *is_first_created = false;
    sh_mem_key_  = key ;
    sh_mem_size_ = size;
    sh_mem_id_ = shmget((key_t)key, size, IPC_CREAT | IPC_EXCL | 0666 ); //IPC_CREAT | IPC_EXCL 

    if (sh_mem_id_ < 0) {
        if(errno == EINVAL ) {
            err_msg_ = std::string("shmget error: key [ ") + 
                       std::to_string(key) + std::string(strerror(errno)) ;
            DEBUG_ELOG(err_msg_);
        } else if(errno == EEXIST || errno == EACCES ) {
            return GetShMem(key,size);
        } else {
            err_msg_ = std::string("shmget error: key [ ") + 
                       std::to_string(key) + std::string(strerror(errno)) ;
            DEBUG_ELOG(err_msg_);
        }
        return false;
    }
    *is_first_created = true;
    return true;
}